

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

ColumnRef __thiscall clickhouse::ColumnDateTime::Slice(ColumnDateTime *this,size_t begin,size_t len)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ColumnRef CVar2;
  shared_ptr<clickhouse::ColumnDateTime> result;
  shared_ptr<clickhouse::ColumnVector<unsigned_int>_> col;
  shared_ptr<clickhouse::Column> *this_00;
  Column *this_01;
  shared_ptr<clickhouse::Column> local_70 [3];
  Column local_40;
  undefined8 local_18;
  
  local_40.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RCX;
  local_18 = in_RDX;
  peVar1 = std::
           __shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1efc02);
  this_01 = &local_40;
  (*(peVar1->super_Column)._vptr_Column[7])
            (this_01,peVar1,local_18,
             local_40.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1efc2f);
  Column::As<clickhouse::ColumnVector<unsigned_int>>(this_01);
  std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x1efc48);
  std::make_shared<clickhouse::ColumnDateTime>();
  std::__shared_ptr_access<clickhouse::ColumnDateTime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<clickhouse::ColumnDateTime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1efc5e);
  peVar1 = std::
           __shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1efc6a);
  this_00 = local_70;
  std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_int>,void>
            (this_00,(shared_ptr<clickhouse::ColumnVector<unsigned_int>_> *)peVar1);
  (*(peVar1->super_Column)._vptr_Column[2])(peVar1,this_00);
  std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x1efca0);
  std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDateTime,void>
            (this_00,(shared_ptr<clickhouse::ColumnDateTime> *)peVar1);
  std::shared_ptr<clickhouse::ColumnDateTime>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnDateTime> *)0x1efcb9);
  std::shared_ptr<clickhouse::ColumnVector<unsigned_int>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<unsigned_int>_> *)0x1efcc3);
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnDateTime::Slice(size_t begin, size_t len) {
    auto col = data_->Slice(begin, len)->As<ColumnUInt32>();
    auto result = std::make_shared<ColumnDateTime>();

    result->data_->Append(col);

    return result;
}